

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O2

int ladspa_segment_end(mixed_segment *segment)

{
  long *plVar1;
  int iVar2;
  
  plVar1 = (long *)segment->data;
  if ((char)plVar1[2] == '\0') {
    mixed_err(10);
    iVar2 = 0;
  }
  else {
    if (*(code **)(*plVar1 + 0x88) == (code *)0x0) {
      mixed_err(4);
    }
    else {
      (**(code **)(*plVar1 + 0x88))(plVar1[1]);
    }
    *(undefined1 *)(plVar1 + 2) = 0;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int ladspa_segment_end(struct mixed_segment *segment){
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  if(!data->active){
    mixed_err(MIXED_SEGMENT_ALREADY_ENDED);
    return 0;
  }
  
  if(data->descriptor->deactivate){
    data->descriptor->deactivate(data->handle);
  }else{
    mixed_err(MIXED_NOT_IMPLEMENTED);
  }
  data->active = 0;
  return 1;
}